

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool config_find_string(ConfigScanner *sc,char *section,char *name,char **result)

{
  ConfigItem *pCVar1;
  ItemValue *in_RCX;
  char *in_RDX;
  ConfigScanner *in_RSI;
  ConfigItem *temp;
  _Bool local_1;
  
  pCVar1 = config_find(in_RSI,in_RDX,(char *)&in_RCX->v_integer);
  if (pCVar1 == (ConfigItem *)0x0) {
    local_1 = false;
  }
  else if (pCVar1->vtype == VTYPE_STRING) {
    *in_RCX = pCVar1->value;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool config_find_string(ConfigScanner *sc, const char *section, char *name, char **result)
{
	ConfigItem *temp = config_find(sc, section, name);
	if (temp == NULL)
	{
		return false;
	}
	if (temp->vtype == VTYPE_STRING)
	{
		*result = temp->value.v_string;
		return true;
	}
	return false;
}